

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_type.cpp
# Opt level: O3

string * __thiscall
duckdb::ExpressionTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ExpressionType type)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar2 = (int)this;
  if (iVar2 < 0x4b) {
    switch(iVar2) {
    case 0xc:
switchD_0122bdc8_caseD_e1:
      pcVar3 = "CAST";
      pcVar1 = "";
      break;
    case 0xd:
      pcVar3 = "NOT";
      pcVar1 = "";
      break;
    case 0xe:
      pcVar3 = "IS_NULL";
      pcVar1 = "";
      break;
    case 0xf:
      pcVar3 = "IS_NOT_NULL";
      pcVar1 = "";
      break;
    case 0x10:
      pcVar3 = "UNPACK";
      pcVar1 = "";
      break;
    default:
      goto switchD_0122bd6b_caseD_53;
    case 0x19:
      pcVar3 = "EQUAL";
      pcVar1 = "";
      break;
    case 0x1a:
      pcVar3 = "NOTEQUAL";
      pcVar1 = "";
      break;
    case 0x1b:
      pcVar3 = "LESSTHAN";
      pcVar1 = "";
      break;
    case 0x1c:
      pcVar3 = "GREATERTHAN";
      pcVar1 = "";
      break;
    case 0x1d:
      pcVar3 = "LESSTHANOREQUALTO";
      pcVar1 = "";
      break;
    case 0x1e:
      pcVar3 = "GREATERTHANOREQUALTO";
      pcVar1 = "";
      break;
    case 0x23:
      pcVar3 = "IN";
      pcVar1 = "";
      break;
    case 0x24:
      pcVar3 = "COMPARE_NOT_IN";
      pcVar1 = "";
      break;
    case 0x25:
      pcVar3 = "DISTINCT_FROM";
      pcVar1 = "";
      break;
    case 0x26:
      pcVar3 = "COMPARE_BETWEEN";
      pcVar1 = "";
      break;
    case 0x27:
      pcVar3 = "COMPARE_NOT_BETWEEN";
      pcVar1 = "";
      break;
    case 0x28:
      pcVar3 = "NOT_DISTINCT_FROM";
      pcVar1 = "";
      break;
    case 0x32:
      pcVar3 = "AND";
      pcVar1 = "";
      break;
    case 0x33:
      pcVar3 = "OR";
      pcVar1 = "";
    }
    goto LAB_0122c2c5;
  }
  switch(iVar2) {
  case 0x4b:
    pcVar3 = "CONSTANT";
    pcVar1 = "";
    break;
  case 0x4c:
    pcVar3 = "PARAMETER";
    pcVar1 = "";
    break;
  case 0x4d:
    pcVar3 = "TUPLE";
    pcVar1 = "";
    break;
  case 0x4e:
    pcVar3 = "TUPLE_ADDRESS";
    pcVar1 = "";
    break;
  case 0x4f:
    pcVar3 = "NULL";
    pcVar1 = "";
    break;
  case 0x50:
    pcVar3 = "VECTOR";
    pcVar1 = "";
    break;
  case 0x51:
    pcVar3 = "SCALAR";
    pcVar1 = "";
    break;
  case 0x52:
    pcVar3 = "VALUE_DEFAULT";
    pcVar1 = "";
    break;
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
    goto switchD_0122bd6b_caseD_53;
  case 100:
    pcVar3 = "AGGREGATE";
    pcVar1 = "";
    break;
  case 0x65:
    pcVar3 = "BOUND_AGGREGATE";
    pcVar1 = "";
    break;
  case 0x66:
    pcVar3 = "GROUPING";
    pcVar1 = "";
    break;
  case 0x6e:
    pcVar3 = "WINDOW_AGGREGATE";
    pcVar1 = "";
    break;
  case 0x78:
    pcVar3 = "RANK";
    pcVar1 = "";
    break;
  case 0x79:
    pcVar3 = "RANK_DENSE";
    pcVar1 = "";
    break;
  case 0x7a:
    pcVar3 = "NTILE";
    pcVar1 = "";
    break;
  case 0x7b:
    pcVar3 = "PERCENT_RANK";
    pcVar1 = "";
    break;
  case 0x7c:
    pcVar3 = "CUME_DIST";
    pcVar1 = "";
    break;
  case 0x7d:
    pcVar3 = "ROW_NUMBER";
    pcVar1 = "";
    break;
  case 0x82:
    pcVar3 = "FIRST_VALUE";
    pcVar1 = "";
    break;
  case 0x83:
    pcVar3 = "LAST_VALUE";
    pcVar1 = "";
    break;
  case 0x84:
    pcVar3 = "LEAD";
    pcVar1 = "";
    break;
  case 0x85:
    pcVar3 = "LAG";
    pcVar1 = "";
    break;
  case 0x86:
    pcVar3 = "NTH_VALUE";
    pcVar1 = "";
    break;
  case 0x8c:
    pcVar3 = "FUNCTION";
    pcVar1 = "";
    break;
  case 0x8d:
    pcVar3 = "BOUND_FUNCTION";
    pcVar1 = "";
    break;
  case 0x96:
    pcVar3 = "CASE";
    pcVar1 = "";
    break;
  case 0x97:
    pcVar3 = "NULLIF";
    pcVar1 = "";
    break;
  case 0x98:
    pcVar3 = "COALESCE";
    pcVar1 = "";
    break;
  case 0x99:
    pcVar3 = "ARRAY_EXTRACT";
    pcVar1 = "";
    break;
  case 0x9a:
    pcVar3 = "ARRAY_SLICE";
    pcVar1 = "";
    break;
  case 0x9b:
    pcVar3 = "STRUCT_EXTRACT";
    pcVar1 = "";
    break;
  case 0x9c:
    pcVar3 = "ARRAY_CONSTRUCTOR";
    pcVar1 = "";
    break;
  case 0x9d:
    pcVar3 = "ARROW";
    pcVar1 = "";
    break;
  case 0x9e:
    pcVar3 = "TRY";
    pcVar1 = "";
    break;
  default:
    switch(iVar2) {
    case 200:
      pcVar3 = "STAR";
      pcVar1 = "";
      break;
    case 0xc9:
      pcVar3 = "TABLE_STAR";
      pcVar1 = "";
      break;
    case 0xca:
      pcVar3 = "PLACEHOLDER";
      pcVar1 = "";
      break;
    case 0xcb:
      pcVar3 = "COLUMN_REF";
      pcVar1 = "";
      break;
    case 0xcc:
      pcVar3 = "FUNCTION_REF";
      pcVar1 = "";
      break;
    case 0xcd:
      pcVar3 = "TABLE_REF";
      pcVar1 = "";
      break;
    case 0xce:
      pcVar3 = "LAMBDA_REF";
      pcVar1 = "";
      break;
    case 0xe1:
      goto switchD_0122bdc8_caseD_e1;
    case 0xe3:
      pcVar3 = "BOUND_REF";
      pcVar1 = "";
      break;
    case 0xe4:
      pcVar3 = "BOUND_COLUMN_REF";
      pcVar1 = "";
      break;
    case 0xe5:
      pcVar3 = "BOUND_UNNEST";
      pcVar1 = "";
      break;
    case 0xe6:
      pcVar3 = "COLLATE";
      pcVar1 = "";
      break;
    case 0xe7:
      pcVar3 = "LAMBDA";
      pcVar1 = "";
      break;
    case 0xe8:
      pcVar3 = "POSITIONAL_REFERENCE";
      pcVar1 = "";
      break;
    case 0xe9:
      pcVar3 = "BOUND_LAMBDA_REF";
      pcVar1 = "";
      break;
    case 0xea:
      pcVar3 = "BOUND_EXPANDED";
      pcVar1 = "";
      break;
    default:
      if (iVar2 == 0xaf) {
        pcVar3 = "SUBQUERY";
        pcVar1 = "";
        break;
      }
    case 0xcf:
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
    case 0xd8:
    case 0xd9:
    case 0xda:
    case 0xdb:
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf:
    case 0xe0:
    case 0xe2:
switchD_0122bd6b_caseD_53:
      pcVar3 = "INVALID";
      pcVar1 = "";
    }
  }
LAB_0122c2c5:
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string ExpressionTypeToString(ExpressionType type) {
	switch (type) {
	case ExpressionType::OPERATOR_CAST:
		return "CAST";
	case ExpressionType::OPERATOR_NOT:
		return "NOT";
	case ExpressionType::OPERATOR_IS_NULL:
		return "IS_NULL";
	case ExpressionType::OPERATOR_IS_NOT_NULL:
		return "IS_NOT_NULL";
	case ExpressionType::OPERATOR_UNPACK:
		return "UNPACK";
	case ExpressionType::COMPARE_EQUAL:
		return "EQUAL";
	case ExpressionType::COMPARE_NOTEQUAL:
		return "NOTEQUAL";
	case ExpressionType::COMPARE_LESSTHAN:
		return "LESSTHAN";
	case ExpressionType::COMPARE_GREATERTHAN:
		return "GREATERTHAN";
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		return "LESSTHANOREQUALTO";
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return "GREATERTHANOREQUALTO";
	case ExpressionType::COMPARE_IN:
		return "IN";
	case ExpressionType::COMPARE_DISTINCT_FROM:
		return "DISTINCT_FROM";
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		return "NOT_DISTINCT_FROM";
	case ExpressionType::CONJUNCTION_AND:
		return "AND";
	case ExpressionType::CONJUNCTION_OR:
		return "OR";
	case ExpressionType::VALUE_CONSTANT:
		return "CONSTANT";
	case ExpressionType::VALUE_PARAMETER:
		return "PARAMETER";
	case ExpressionType::VALUE_TUPLE:
		return "TUPLE";
	case ExpressionType::VALUE_TUPLE_ADDRESS:
		return "TUPLE_ADDRESS";
	case ExpressionType::VALUE_NULL:
		return "NULL";
	case ExpressionType::VALUE_VECTOR:
		return "VECTOR";
	case ExpressionType::VALUE_SCALAR:
		return "SCALAR";
	case ExpressionType::AGGREGATE:
		return "AGGREGATE";
	case ExpressionType::WINDOW_AGGREGATE:
		return "WINDOW_AGGREGATE";
	case ExpressionType::WINDOW_RANK:
		return "RANK";
	case ExpressionType::WINDOW_RANK_DENSE:
		return "RANK_DENSE";
	case ExpressionType::WINDOW_PERCENT_RANK:
		return "PERCENT_RANK";
	case ExpressionType::WINDOW_ROW_NUMBER:
		return "ROW_NUMBER";
	case ExpressionType::WINDOW_FIRST_VALUE:
		return "FIRST_VALUE";
	case ExpressionType::WINDOW_LAST_VALUE:
		return "LAST_VALUE";
	case ExpressionType::WINDOW_NTH_VALUE:
		return "NTH_VALUE";
	case ExpressionType::WINDOW_CUME_DIST:
		return "CUME_DIST";
	case ExpressionType::WINDOW_LEAD:
		return "LEAD";
	case ExpressionType::WINDOW_LAG:
		return "LAG";
	case ExpressionType::WINDOW_NTILE:
		return "NTILE";
	case ExpressionType::FUNCTION:
		return "FUNCTION";
	case ExpressionType::CASE_EXPR:
		return "CASE";
	case ExpressionType::OPERATOR_NULLIF:
		return "NULLIF";
	case ExpressionType::OPERATOR_COALESCE:
		return "COALESCE";
	case ExpressionType::OPERATOR_TRY:
		return "TRY";
	case ExpressionType::ARRAY_EXTRACT:
		return "ARRAY_EXTRACT";
	case ExpressionType::ARRAY_SLICE:
		return "ARRAY_SLICE";
	case ExpressionType::STRUCT_EXTRACT:
		return "STRUCT_EXTRACT";
	case ExpressionType::SUBQUERY:
		return "SUBQUERY";
	case ExpressionType::STAR:
		return "STAR";
	case ExpressionType::PLACEHOLDER:
		return "PLACEHOLDER";
	case ExpressionType::COLUMN_REF:
		return "COLUMN_REF";
	case ExpressionType::LAMBDA_REF:
		return "LAMBDA_REF";
	case ExpressionType::FUNCTION_REF:
		return "FUNCTION_REF";
	case ExpressionType::TABLE_REF:
		return "TABLE_REF";
	case ExpressionType::CAST:
		return "CAST";
	case ExpressionType::COMPARE_NOT_IN:
		return "COMPARE_NOT_IN";
	case ExpressionType::COMPARE_BETWEEN:
		return "COMPARE_BETWEEN";
	case ExpressionType::COMPARE_NOT_BETWEEN:
		return "COMPARE_NOT_BETWEEN";
	case ExpressionType::VALUE_DEFAULT:
		return "VALUE_DEFAULT";
	case ExpressionType::BOUND_REF:
		return "BOUND_REF";
	case ExpressionType::BOUND_COLUMN_REF:
		return "BOUND_COLUMN_REF";
	case ExpressionType::BOUND_FUNCTION:
		return "BOUND_FUNCTION";
	case ExpressionType::BOUND_AGGREGATE:
		return "BOUND_AGGREGATE";
	case ExpressionType::GROUPING_FUNCTION:
		return "GROUPING";
	case ExpressionType::ARRAY_CONSTRUCTOR:
		return "ARRAY_CONSTRUCTOR";
	case ExpressionType::TABLE_STAR:
		return "TABLE_STAR";
	case ExpressionType::BOUND_UNNEST:
		return "BOUND_UNNEST";
	case ExpressionType::COLLATE:
		return "COLLATE";
	case ExpressionType::POSITIONAL_REFERENCE:
		return "POSITIONAL_REFERENCE";
	case ExpressionType::BOUND_LAMBDA_REF:
		return "BOUND_LAMBDA_REF";
	case ExpressionType::LAMBDA:
		return "LAMBDA";
	case ExpressionType::ARROW:
		return "ARROW";
	case ExpressionType::BOUND_EXPANDED:
		return "BOUND_EXPANDED";
	case ExpressionType::INVALID:
		break;
	}
	return "INVALID";
}